

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_open_filename.c
# Opt level: O0

int64_t file_skip_lseek(archive_conflict *a,void *client_data,int64_t request)

{
  __off_t _Var1;
  int *piVar2;
  __off_t _Var3;
  wchar_t skip_bits;
  off_t skip;
  off_t new_offset;
  off_t old_offset;
  read_file_data *mine;
  int64_t request_local;
  void *client_data_local;
  archive_conflict *a_local;
  
  _Var1 = lseek(*client_data,0,1);
  if (-1 < _Var1) {
    if ((_Var1 < *(long *)((long)client_data + 0x20)) &&
       (request <= *(long *)((long)client_data + 0x20) - _Var1)) {
      _Var3 = lseek(*client_data,request,1);
      if (-1 < _Var3) {
        return _Var3 - _Var1;
      }
    }
    else {
      piVar2 = __errno_location();
      *piVar2 = 0x1d;
    }
  }
  *(undefined1 *)((long)client_data + 0x28) = 0;
  piVar2 = __errno_location();
  if (*piVar2 == 0x1d) {
    a_local = (archive_conflict *)0x0;
  }
  else {
    if (*(int *)((long)client_data + 0x2c) == 0) {
      piVar2 = __errno_location();
      archive_set_error((archive *)a,*piVar2,"Error seeking in stdin");
    }
    else if (*(int *)((long)client_data + 0x2c) == 1) {
      piVar2 = __errno_location();
      archive_set_error((archive *)a,*piVar2,"Error seeking in \'%s\'",(long)client_data + 0x30);
    }
    else {
      piVar2 = __errno_location();
      archive_set_error((archive *)a,*piVar2,"Error seeking in \'%ls\'",(long)client_data + 0x30);
    }
    a_local = (archive_conflict *)0xffffffffffffffff;
  }
  return (int64_t)a_local;
}

Assistant:

static int64_t
file_skip_lseek(struct archive *a, void *client_data, int64_t request)
{
	struct read_file_data *mine = (struct read_file_data *)client_data;
#if defined(_WIN32) && !defined(__CYGWIN__)
	/* We use _lseeki64() on Windows. */
	int64_t old_offset, new_offset, skip = request;
#else
	off_t old_offset, new_offset, skip = (off_t)request;
#endif
	int skip_bits = sizeof(skip) * 8 - 1;

	/* We use off_t here because lseek() is declared that way. */

	/* Reduce a request that would overflow the 'skip' variable. */
	if (sizeof(request) > sizeof(skip)) {
		const int64_t max_skip =
		    (((int64_t)1 << (skip_bits - 1)) - 1) * 2 + 1;
		if (request > max_skip)
			skip = max_skip;
	}

	if ((old_offset = lseek(mine->fd, 0, SEEK_CUR)) >= 0) {
		if (old_offset >= mine->size ||
		    skip > mine->size - old_offset) {
			/* Do not seek past end of file. */
			errno = ESPIPE;
		} else if ((new_offset = lseek(mine->fd, skip, SEEK_CUR)) >= 0)
			return (new_offset - old_offset);
	}

	/* If lseek() fails, don't bother trying again. */
	mine->use_lseek = 0;

	/* Let libarchive recover with read+discard */
	if (errno == ESPIPE)
		return (0);

	/* If the input is corrupted or truncated, fail. */
	if (mine->filename_type == FNT_STDIN)
		archive_set_error(a, errno, "Error seeking in stdin");
	else if (mine->filename_type == FNT_MBS)
		archive_set_error(a, errno, "Error seeking in '%s'",
		    mine->filename.m);
	else
		archive_set_error(a, errno, "Error seeking in '%ls'",
		    mine->filename.w);
	return (-1);
}